

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::CompiledType::getSchema
          (Maybe<capnp::Type> *__return_storage_ptr__,CompiledType *this)

{
  Compiler *pCVar1;
  Builder target;
  Reader proto;
  BrandedDecl *this_00;
  Schema local_2e0;
  Reader local_2d8;
  Type local_2a8;
  Impl *local_298;
  SegmentBuilder *pSStack_290;
  CapTableBuilder *local_288;
  void *pvStack_280;
  WirePointer *local_278;
  undefined1 local_260 [8];
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  undefined1 auStack_240 [8];
  Builder builder;
  undefined1 local_208 [8];
  MallocMessageBuilder message;
  word scratch [32];
  CompiledType *this_local;
  
  message.moreSegments.builder.disposer = (ArrayDisposer *)0x0;
  kj::ArrayPtr<capnp::word>::ArrayPtr<32ul>
            ((ArrayPtr<capnp::word> *)&builder._builder.dataSize,
             (word (*) [32])&message.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_208,stack0xfffffffffffffde8,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::schema::Type>((Builder *)auStack_240,(MessageBuilder *)local_208);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_260,
             &this->compiler->impl);
  this_00 = kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::
            get<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>const>
                      (&this->decl,
                       (Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)
                       local_260);
  local_278 = builder._builder.pointers;
  local_288 = builder._builder.capTable;
  pvStack_280 = builder._builder.data;
  local_298 = (Impl *)auStack_240;
  pSStack_290 = builder._builder.segment;
  target._builder.capTable = (CapTableBuilder *)builder._builder.segment;
  target._builder.segment = (SegmentBuilder *)auStack_240;
  target._builder.data = builder._builder.capTable;
  target._builder.pointers = (WirePointer *)builder._builder.data;
  target._builder._32_8_ = builder._builder.pointers;
  BrandedDecl::compileAsType(this_00,(ErrorReporter *)&ErrorIgnorer::instance,target);
  kj::Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_260);
  pCVar1 = this->compiler;
  capnp::schema::Type::Builder::asReader(&local_2d8,(Builder *)auStack_240);
  Schema::Schema(&local_2e0);
  proto._reader.capTable = local_2d8._reader.capTable;
  proto._reader.segment = local_2d8._reader.segment;
  proto._reader.data = local_2d8._reader.data;
  proto._reader.pointers = local_2d8._reader.pointers;
  proto._reader.dataSize = local_2d8._reader.dataSize;
  proto._reader.pointerCount = local_2d8._reader.pointerCount;
  proto._reader._38_2_ = local_2d8._reader._38_2_;
  proto._reader.nestingLimit = local_2d8._reader.nestingLimit;
  proto._reader._44_4_ = local_2d8._reader._44_4_;
  local_2a8 = SchemaLoader::getType(&pCVar1->loader,proto,local_2e0);
  kj::Maybe<capnp::Type>::Maybe(__return_storage_ptr__,&local_2a8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_208);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::CompiledType::getSchema() {
  capnp::word scratch[32];
  memset(&scratch, 0, sizeof(scratch));
  capnp::MallocMessageBuilder message(scratch);
  auto builder = message.getRoot<schema::Type>();

  {
    auto lock = compiler.impl.lockShared();
    decl.get(lock).compileAsType(ErrorIgnorer::instance, builder);
  }

  // No need to pass `scope` as second parameter since CompiledType always represents a type
  // expression evaluated free-standing, not in any scope.
  return compiler.loader.getType(builder.asReader());
}